

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_buffer_stream.h
# Opt level: O0

int __thiscall crnlib::buffer_stream::open(buffer_stream *this,char *__file,int __oflag,...)

{
  uint uVar1;
  uint size_local;
  void *p_local;
  buffer_stream *this_local;
  
  uVar1 = (*(this->super_data_stream)._vptr_data_stream[3])();
  if ((__file == (char *)0x0) || (__oflag == 0)) {
    this_local._7_1_ = 0;
    this = (buffer_stream *)(ulong)uVar1;
  }
  else {
    (this->super_data_stream).field_0x1a = (this->super_data_stream).field_0x1a & 0xfe | 1;
    this->m_pBuf = (uint8 *)__file;
    this->m_size = __oflag;
    this->m_ofs = 0;
    (this->super_data_stream).m_attribs = 5;
    this_local._7_1_ = 1;
  }
  return (int)CONCAT71((int7)((ulong)this >> 8),this_local._7_1_);
}

Assistant:

bool open(const void* p, uint size)
        {
            CRNLIB_ASSERT(p);

            close();

            if ((!p) || (!size))
            {
                return false;
            }

            m_opened = true;
            m_pBuf = (uint8*)(p);
            m_size = size;
            m_ofs = 0;
            m_attribs = cDataStreamSeekable | cDataStreamReadable;
            return true;
        }